

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command_User.cpp
# Opt level: O2

void __thiscall
userClass::changePassword(userClass *this,string *userID,string *newPass,string *oldPass)

{
  __type _Var1;
  bool bVar2;
  vector<int,_std::allocator<int>_> index;
  string password_origin;
  string local_278;
  string local_258;
  fstream file;
  
  std::__cxx11::string::string((string *)&local_258,(string *)userID);
  unrolledLinkedListClass::readIndexData(&index,&Userid,&local_258,'0');
  std::__cxx11::string::~string((string *)&local_258);
  if ((long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    success = '0';
    puts("Invalid");
    goto LAB_001044a8;
  }
  std::fstream::fstream(&file);
  std::fstream::open((char *)&file,0x10c098);
  std::istream::seekg(&file,(long)*index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start * 0x5b + 0x3d,0);
  password_origin._M_dataplus._M_p = (pointer)&password_origin.field_2;
  password_origin._M_string_length = 0;
  password_origin.field_2._M_local_buf[0] = '\0';
  read_string(&file,&password_origin,0x1e);
  _Var1 = std::operator==(oldPass,&password_origin);
  if (_Var1) {
LAB_00104407:
    std::__cxx11::string::string((string *)&local_278,(string *)newPass);
    dataClass::changeUserData
              ((dataClass *)&data_manager,&local_278,
               *index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start);
    std::__cxx11::string::~string((string *)&local_278);
    _Var1 = std::operator==(&this->userID,userID);
    if (_Var1) {
      std::__cxx11::string::_M_assign((string *)&this->password);
    }
  }
  else {
    bVar2 = std::operator==(oldPass,"#");
    if (bVar2) goto LAB_00104407;
    success = '0';
    puts("Invalid");
  }
  std::fstream::close();
  std::__cxx11::string::~string((string *)&password_origin);
  std::fstream::~fstream(&file);
LAB_001044a8:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&index.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void userClass::changePassword(string userID, string newPass, string oldPass) {
	vector<int> index = Userid.readIndexData(userID, '0');
	if (index.size() != 1) {ERROR; return ;}
	fstream file;
	file.open("Data_User.dat", ios::in | ios::binary);
	file.seekg(index[0] * 91 + 61);
	string password_origin;
	read_string(file, password_origin, 30);
	if (oldPass == password_origin || oldPass == "#"){
		data_manager.changeUserData(newPass, index[0]);
		if (this->userID == userID) this->password = newPass;
	} else ERROR;
	file.close();
}